

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmark.cpp
# Opt level: O2

void __thiscall
QBenchmarkTestMethodData::setResults
          (QBenchmarkTestMethodData *this,QList<QBenchmarkMeasurerBase::Measurement> *list,
          bool setByMacro)

{
  qreal *pqVar1;
  Measurement *pMVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  qreal qVar7;
  undefined1 local_58 [31];
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((list->d).size == 0) {
    qVar7 = 0.0;
    uVar6 = 0;
  }
  else {
    pMVar2 = (list->d).ptr;
    qVar7 = pMVar2->value;
    uVar6 = (ulong)pMVar2->metric;
  }
  local_39 = setByMacro;
  if (QBenchmarkGlobalData::current->iterationCount == -1) {
    if ((setByMacro) && (current->runOnce == false)) {
      if (QBenchmarkGlobalData::current->walltimeMinimum == -1) {
        iVar4 = (*QBenchmarkGlobalData::current->measurer->_vptr_QBenchmarkMeasurerBase[4])
                          (QBenchmarkGlobalData::current->measurer,uVar6);
        if ((char)iVar4 == '\0') goto LAB_00118fd9;
      }
      else if (qVar7 <= (double)QBenchmarkGlobalData::current->walltimeMinimum) {
LAB_00118fd9:
        this->iterationCount = this->iterationCount << 1;
        goto LAB_00118f48;
      }
    }
    else {
      this->iterationCount = 1;
    }
  }
  this->resultAccepted = true;
LAB_00118f48:
  this->valid = true;
  QList<QBenchmarkResult>::reserve(&this->results,(list->d).size);
  pMVar2 = (list->d).ptr;
  lVar3 = (list->d).size;
  for (lVar5 = 0; lVar3 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    pqVar1 = (qreal *)((long)&pMVar2->value + lVar5);
    local_58._0_8_ = *pqVar1;
    local_58._8_8_ = pqVar1[1];
    QList<QBenchmarkResult>::
    emplaceBack<QBenchmarkContext&,QBenchmarkMeasurerBase::Measurement&,int&,bool&>
              (&this->results,&QBenchmarkGlobalData::current->context,(Measurement *)local_58,
               &this->iterationCount,&local_39);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBenchmarkTestMethodData::setResults(const QList<QBenchmarkMeasurerBase::Measurement> &list,
                                          bool setByMacro)
{
    bool accepted = false;
    QBenchmarkMeasurerBase::Measurement firstMeasurement = {};
    if (!list.isEmpty())
        firstMeasurement = list.constFirst();

    // Always accept the result if the iteration count has been
    // specified on the command line with -iterations.
    if (QBenchmarkGlobalData::current->iterationCount != -1)
        accepted = true;

    else if (QBenchmarkTestMethodData::current->runOnce || !setByMacro) {
        iterationCount = 1;
        accepted = true;
    }

    // Test the result directly without calling the measurer if the minimum time
    // has been specified on the command line with -minimumvalue.
    else if (QBenchmarkGlobalData::current->walltimeMinimum != -1)
        accepted = (firstMeasurement.value > QBenchmarkGlobalData::current->walltimeMinimum);
    else
        accepted = QBenchmarkGlobalData::current->measurer->isMeasurementAccepted(firstMeasurement);

    // Accept the result or double the number of iterations.
    if (accepted)
        resultAccepted = true;
    else
        iterationCount *= 2;

    valid = true;
    results.reserve(list.size());
    for (auto m : list)
        results.emplaceBack(QBenchmarkGlobalData::current->context, m, iterationCount, setByMacro);
}